

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

Offset<reflection::Service> __thiscall
flatbuffers::ServiceDef::Serialize(ServiceDef *this,FlatBufferBuilder *builder,Parser *parser)

{
  string_view str;
  bool bVar1;
  Offset<flatbuffers::String> name;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int>_> calls;
  Offset<flatbuffers::String> declaration_file;
  Offset<reflection::Service> OVar2;
  reference ppRVar3;
  allocator<char> local_b9;
  Offset<flatbuffers::String> file__;
  string decl_file_in_project;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> docs__;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attr__;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int>_> call__;
  Offset<flatbuffers::String> name__;
  string qualified_name;
  value_type local_54;
  __normal_iterator<flatbuffers::RPCCall_*const_*,_std::vector<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>_>
  local_50;
  __normal_iterator<flatbuffers::RPCCall_*const_*,_std::vector<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>_>
  local_48;
  const_iterator it;
  vector<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
  servicecall_offsets;
  Parser *parser_local;
  FlatBufferBuilder *builder_local;
  ServiceDef *this_local;
  
  std::
  vector<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
  ::vector((vector<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
            *)&it);
  local_48._M_current =
       (RPCCall **)
       std::vector<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>::begin
                 (&(this->calls).vec);
  while( true ) {
    local_50._M_current =
         (RPCCall **)
         std::vector<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>::end
                   (&(this->calls).vec);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    ppRVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::RPCCall_*const_*,_std::vector<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>_>
              ::operator*(&local_48);
    local_54.o = (offset_type)RPCCall::Serialize(*ppRVar3,builder,parser);
    std::
    vector<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
    ::push_back((vector<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
                 *)&it,&local_54);
    __gnu_cxx::
    __normal_iterator<flatbuffers::RPCCall_*const_*,_std::vector<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>_>
    ::operator++(&local_48);
  }
  Namespace::GetFullyQualifiedName
            ((string *)&call__,(this->super_Definition).defined_namespace,(string *)this,1000);
  name = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(builder,(string *)&call__);
  calls = FlatBufferBuilderImpl<false>::
          CreateVector<flatbuffers::Offset<reflection::RPCCall>,std::allocator<flatbuffers::Offset<reflection::RPCCall>>>
                    (builder,(vector<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
                              *)&it);
  decl_file_in_project.field_2._12_4_ =
       Definition::SerializeAttributes(&this->super_Definition,builder,parser);
  if ((((parser->opts).binary_schema_comments & 1U) == 0) ||
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&(this->super_Definition).doc_comment), bVar1)) {
    Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
                *)((long)&decl_file_in_project.field_2 + 8),0);
  }
  else {
    decl_file_in_project.field_2._8_4_ =
         FlatBufferBuilderImpl<false>::
         CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                   (builder,&(this->super_Definition).doc_comment);
  }
  if ((this->super_Definition).declaration_file == (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&file__,"",&local_b9);
    std::allocator<char>::~allocator(&local_b9);
  }
  else {
    std::__cxx11::string::string
              ((string *)&file__,(string *)(this->super_Definition).declaration_file);
  }
  str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&file__);
  declaration_file = FlatBufferBuilderImpl<false>::CreateSharedString(builder,str);
  OVar2 = reflection::CreateService
                    (builder,name,calls,
                     (Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
                      )decl_file_in_project.field_2._12_4_,
                     (Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
                      )decl_file_in_project.field_2._8_4_,declaration_file);
  std::__cxx11::string::~string((string *)&file__);
  std::__cxx11::string::~string((string *)&call__);
  std::
  vector<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
  ::~vector((vector<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
             *)&it);
  return (Offset<reflection::Service>)OVar2.o;
}

Assistant:

Offset<reflection::Service> ServiceDef::Serialize(FlatBufferBuilder *builder,
                                                  const Parser &parser) const {
  std::vector<Offset<reflection::RPCCall>> servicecall_offsets;
  for (auto it = calls.vec.begin(); it != calls.vec.end(); ++it) {
    servicecall_offsets.push_back((*it)->Serialize(builder, parser));
  }
  const auto qualified_name = defined_namespace->GetFullyQualifiedName(name);
  const auto name__ = builder->CreateString(qualified_name);
  const auto call__ = builder->CreateVector(servicecall_offsets);
  const auto attr__ = SerializeAttributes(builder, parser);
  const auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                          ? builder->CreateVectorOfStrings(doc_comment)
                          : 0;
  std::string decl_file_in_project = declaration_file ? *declaration_file : "";
  const auto file__ = builder->CreateSharedString(decl_file_in_project);
  return reflection::CreateService(*builder, name__, call__, attr__, docs__,
                                   file__);
}